

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_help(void)

{
  print_version();
  fprintf(_stderr,
          "Usage: spirv-cross <...>\n\nBasic:\n\t[SPIR-V file] (- is stdin)\n\t[--output <output path>]: If not provided, prints output to stdout.\n\t[--dump-resources]:\n\t\tPrints a basic reflection of the SPIR-V module along with other output.\n\t[--help]:\n\t\tPrints this help message.\n"
         );
  print_help_backend();
  print_help_common();
  print_help_glsl();
  print_help_msl();
  print_help_hlsl();
  print_help_obscure();
  return;
}

Assistant:

static void print_help()
{
	print_version();

	// clang-format off
	fprintf(stderr, "Usage: spirv-cross <...>\n"
	                "\nBasic:\n"
	                "\t[SPIR-V file] (- is stdin)\n"
	                "\t[--output <output path>]: If not provided, prints output to stdout.\n"
	                "\t[--dump-resources]:\n\t\tPrints a basic reflection of the SPIR-V module along with other output.\n"
	                "\t[--help]:\n\t\tPrints this help message.\n"
	);
	// clang-format on

	print_help_backend();
	print_help_common();
	print_help_glsl();
	print_help_msl();
	print_help_hlsl();
	print_help_obscure();
}